

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

Error * ot::commissioner::tlv::GetTlvSet
                  (Error *__return_storage_ptr__,TlvSet *aTlvSet,ByteArray *aBuf,Scope aScope)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  Type e;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  mapped_type *this;
  utils *this_00;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  string_view fmt;
  int local_19c;
  string local_198;
  v10 local_174 [2];
  anon_class_1_0_00000001 local_172;
  v10 local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  char *local_168;
  string local_160;
  allocator local_139;
  string local_138;
  Type local_111;
  ErrorCode local_110 [4];
  undefined1 local_100 [8];
  TlvPtr tlv;
  size_t offset;
  Scope aScope_local;
  ByteArray *aBuf_local;
  TlvSet *aTlvSet_local;
  Error *error;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *local_90;
  string *local_88;
  v10 *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  bVar1 = false;
  Error::Error(__return_storage_ptr__);
  tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    _Var2._M_pi = tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
    if (p_Var4 <= _Var2._M_pi) goto LAB_002cfc81;
    Tlv::Deserialize((Tlv *)local_100,__return_storage_ptr__,
                     (size_t *)
                     &tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,aBuf,aScope);
    local_110[0] = kNone;
    bVar3 = commissioner::operator!=(__return_storage_ptr__,local_110);
    if (bVar3) {
      local_19c = 6;
    }
    else {
      bVar3 = std::operator!=((shared_ptr<ot::commissioner::tlv::Tlv> *)local_100,(nullptr_t)0x0);
      if (!bVar3) {
        abort();
      }
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_100);
      bVar3 = Tlv::IsValid(peVar5);
      if (bVar3) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        local_111 = Tlv::GetType(peVar5);
        this = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[](aTlvSet,&local_111);
        std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                  (this,(shared_ptr<ot::commissioner::tlv::Tlv> *)local_100);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,"coap",&local_139);
        GetTlvSet::anon_class_1_0_00000001::operator()(&local_172);
        local_58 = &local_170;
        local_60 = &local_171;
        bVar6 = ::fmt::v10::operator()(local_60);
        local_168 = (char *)bVar6.size_;
        local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        e = Tlv::GetType(peVar5);
        local_174[0] = (v10)utils::to_underlying<ot::commissioner::tlv::Type>(e);
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        this_00 = (utils *)Tlv::GetValue(peVar5);
        utils::Hex_abi_cxx11_(&local_198,this_00,aBytes);
        local_68 = &local_160;
        local_78 = local_170;
        pcStack_70 = local_168;
        local_80 = local_174;
        local_88 = &local_198;
        local_50 = &local_78;
        local_98 = local_170;
        local_90 = local_168;
        local_48 = local_98;
        pcStack_40 = local_90;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char,std::__cxx11::string>
                  ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&error,local_80,(uchar *)local_88,local_170);
        local_30 = local_a8;
        local_38 = &error;
        local_20 = 0xd2;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        fmt.size_ = 0xd2;
        fmt.data_ = local_90;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_160,(v10 *)local_98,fmt,args);
        Log(kWarn,&local_138,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      local_19c = 0;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_100);
  } while (local_19c == 0);
  if (local_19c == 6) {
LAB_002cfc81:
    bVar1 = true;
  }
  if (!bVar1) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetTlvSet(TlvSet &aTlvSet, const ByteArray &aBuf, Scope aScope)
{
    Error  error;
    size_t offset = 0;

    while (offset < aBuf.size())
    {
        auto tlv = tlv::Tlv::Deserialize(error, offset, aBuf, aScope);
        SuccessOrExit(error);
        VerifyOrDie(tlv != nullptr);

        if (tlv->IsValid())
        {
            aTlvSet[tlv->GetType()] = tlv;
        }
        else
        {
            // Drop invalid TLVs
            LOG_WARN(LOG_REGION_COAP, "dropping invalid/unknown TLV(type={}, value={})",
                     utils::to_underlying(tlv->GetType()), utils::Hex(tlv->GetValue()));
        }
    }

exit:
    return error;
}